

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O3

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,cmTargetLinkLibraryType llt)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  PolicyStatus PVar6;
  string *psVar7;
  ostream *poVar8;
  size_t sVar9;
  cmMakefile *pcVar10;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar11;
  size_type sVar12;
  long *plVar13;
  cmake *this_01;
  size_type *psVar14;
  PolicyID id;
  PolicyID id_00;
  uint uVar15;
  string *dc_1;
  _Alloc_hider _Var16;
  char *pcVar17;
  char *pcVar18;
  string *dc;
  MessageType t;
  string libRef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream e;
  string local_210;
  cmTargetLinkLibraryType local_1ec;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  TVar5 = cmTarget::GetType(this->Target);
  if ((TVar5 == INTERFACE_LIBRARY) &&
     (this->CurrentProcessingState != ProcessingKeywordLinkInterface)) {
    pcVar1 = (this->super_cmCommand).Makefile;
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8);
LAB_002a1989:
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    return false;
  }
  bVar4 = cmTarget::IsImported(this->Target);
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface && bVar4) {
    pcVar1 = (this->super_cmCommand).Makefile;
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "IMPORTED library can only be used with the INTERFACE keyword of target_link_libraries"
               ,"");
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_1a8);
    goto LAB_002a1989;
  }
  uVar15 = this->CurrentProcessingState - ProcessingKeywordLinkInterface;
  pcVar11 = this->Target;
  local_1ec = llt;
  cmMakefile::GetExecutionContext((cmListFileContext *)local_1a8,(this->super_cmCommand).Makefile);
  bVar4 = cmTarget::PushTLLCommandTrace(pcVar11,(uint)(4 < uVar15),(cmListFileContext *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_p != local_178) {
    operator_delete(local_188._M_p,local_178[0]._M_allocated_capacity + 1);
  }
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,
                    CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1);
  }
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023,false);
    if (PVar6 - NEW < 3) {
      pcVar18 = "must";
      t = FATAL_ERROR;
      bVar4 = true;
LAB_002a1ae0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The ",4);
      pcVar17 = "keyword";
      if (4 >= uVar15) {
        pcVar17 = "plain";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar17,(ulong)(4 < uVar15) * 2 + 5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 " signature for target_link_libraries has already been used with the target \"",
                 0x4c);
      psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"\".  All uses of target_link_libraries with a target ",0x34);
      sVar9 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar18,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," be either all-keyword or all-plain.\n",0x25);
      cmTarget::GetTllSignatureTraces(this->Target,(ostream *)local_1a8,(uint)(uVar15 < 5));
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,t,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      if (bVar4) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
    }
    else if (PVar6 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x17,id);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      pcVar18 = "should";
      bVar4 = false;
      t = AUTHOR_WARNING;
      goto LAB_002a1ae0;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  pcVar10 = cmTarget::GetMakefile(this->Target);
  if (pcVar1 == pcVar10) {
    bVar3 = false;
    bVar4 = false;
LAB_002a1d3b:
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
LAB_002a1d51:
    std::__cxx11::string::_M_assign((string *)&local_1e8);
    if (1 < this->CurrentProcessingState - ProcessingPlainLinkInterface) {
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Attempt to add link library \"",0x1d);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" to target \"",0xd);
        psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\" which is not built in this directory.\n",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"This is allowed only when policy CMP0079 is set to NEW.",0x37);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar4 = false;
        goto LAB_002a2574;
      }
LAB_002a1efb:
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      pcVar11 = cmGlobalGenerator::FindTarget(this_00,lib,false);
      if (((((pcVar11 != (cmTarget *)0x0) &&
            (TVar5 = cmTarget::GetType(pcVar11), TVar5 != STATIC_LIBRARY)) &&
           (TVar5 = cmTarget::GetType(pcVar11), TVar5 != SHARED_LIBRARY)) &&
          ((TVar5 = cmTarget::GetType(pcVar11), TVar5 != UNKNOWN_LIBRARY &&
           (TVar5 = cmTarget::GetType(pcVar11), TVar5 != OBJECT_LIBRARY)))) &&
         ((TVar5 = cmTarget::GetType(pcVar11), TVar5 != INTERFACE_LIBRARY &&
          (bVar4 = cmTarget::IsExecutableWithExports(pcVar11), !bVar4)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" of type ",10);
        TVar5 = cmTarget::GetType(pcVar11);
        pcVar18 = cmState::GetTargetTypeName(TVar5);
        poVar8 = std::operator<<(poVar8,pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   " may not be linked into another target.  One may link only to INTERFACE, OBJECT, STATIC or SHARED libraries, or to executables with the ENABLE_EXPORTS property set."
                   ,0xa4);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      cmTarget::AddLinkLibrary
                (this->Target,(this->super_cmCommand).Makefile,lib,&local_1e8,local_1ec);
    }
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_210,(cmPolicies *)0x4f,id_00);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\nTarget\n  ",10);
      psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "\nis not created in this directory.  For compatibility with older versions of CMake, link library\n  "
                 ,99);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(lib->_M_dataplus)._M_p,lib->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,
                 "\nwill be looked up in the directory in which the target was created rather than in this calling directory."
                 ,0x6a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  else {
    bVar3 = false;
    PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0079,false);
    if (2 < PVar6 - NEW) {
      if (PVar6 == OLD) {
        bVar4 = true;
        bVar3 = false;
      }
      else {
        bVar4 = false;
        if (PVar6 == WARN) {
          bVar3 = true;
          bVar4 = true;
        }
      }
      goto LAB_002a1d3b;
    }
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    bVar4 = cmsys::SystemTools::FileIsFullPath(lib);
    if (bVar4) {
      bVar4 = false;
      bVar3 = false;
      goto LAB_002a1d51;
    }
    cmMakefile::GetDirectoryId((cmDirectoryId *)local_1a8,(this->super_cmCommand).Makefile);
    pcVar2 = (lib->_M_dataplus)._M_p;
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar2,pcVar2 + lib->_M_string_length);
    std::__cxx11::string::append((char *)&local_1c8);
    plVar13 = (long *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1a8);
    psVar14 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210.field_2._8_8_ = plVar13[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar14;
      local_210._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_210._M_string_length = plVar13[1];
    *plVar13 = (long)psVar14;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    if (1 < this->CurrentProcessingState - ProcessingPlainLinkInterface) {
      bVar3 = false;
      goto LAB_002a1efb;
    }
  }
  pcVar11 = this->Target;
  if (this->CurrentProcessingState - ProcessingPlainPrivateInterface < 2) {
    TVar5 = cmTarget::GetType(pcVar11);
    if (TVar5 != STATIC_LIBRARY) {
      TVar5 = cmTarget::GetType(this->Target);
      bVar4 = true;
      if (TVar5 != OBJECT_LIBRARY) goto LAB_002a2574;
    }
    cmTarget::GetDebugGeneratorExpressions((string *)local_1a8,this->Target,&local_1e8,local_1ec);
    bVar4 = cmGeneratorExpression::IsValidTargetName(lib);
    if ((bVar4) || (sVar12 = cmGeneratorExpression::Find(lib), sVar12 != 0xffffffffffffffff)) {
      std::operator+(&local_1c8,"$<LINK_ONLY:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8)
      ;
      plVar13 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      psVar14 = (size_type *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210.field_2._8_8_ = plVar13[3];
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar14;
        local_210._M_dataplus._M_p = (pointer)*plVar13;
      }
      local_210._M_string_length = plVar13[1];
      *plVar13 = (long)psVar14;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar11 = this->Target;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"INTERFACE_LINK_LIBRARIES","");
    cmTarget::AppendProperty(pcVar11,&local_210,(char *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    bVar4 = true;
  }
  else {
    local_1a8 = (undefined1  [8])&local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"INTERFACE_LINK_LIBRARIES","");
    cmTarget::GetDebugGeneratorExpressions(&local_210,this->Target,&local_1e8,local_1ec);
    cmTarget::AppendProperty(pcVar11,(string *)local_1a8,local_210._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,
                      CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) + 1)
      ;
    }
    bVar4 = true;
    if (((this->CurrentProcessingState != ProcessingLinkLibraries) &&
        (PVar6 = cmTarget::GetPolicyStatus(this->Target,CMP0022), PVar6 < NEW)) &&
       (TVar5 = cmTarget::GetType(this->Target), TVar5 != INTERFACE_LIBRARY)) {
      this_01 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::GetDebugConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1c8,this_01);
      sVar12 = local_1c8._M_string_length;
      local_1a8 = (undefined1  [8])&local_198;
      local_1a0 = (char *)0x0;
      local_198._M_local_buf[0] = '\0';
      if ((local_1ec < OPTIMIZED_LibraryType) &&
         (local_1c8._M_dataplus._M_p != (pointer)local_1c8._M_string_length)) {
        _Var16._M_p = local_1c8._M_dataplus._M_p;
        do {
          std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_1a0,0x56c0bb);
          std::__cxx11::string::_M_append((char *)local_1a8,*(ulong *)_Var16._M_p);
          cmTarget::AppendProperty
                    (this->Target,(string *)local_1a8,local_1e8._M_dataplus._M_p,false);
          _Var16._M_p = _Var16._M_p + 0x20;
        } while (_Var16._M_p != (pointer)sVar12);
      }
      if ((local_1ec & ~OPTIMIZED_LibraryType) == GENERAL_LibraryType) {
        pcVar11 = this->Target;
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_210,"LINK_INTERFACE_LIBRARIES","");
        cmTarget::AppendProperty(pcVar11,&local_210,local_1e8._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if (local_1c8._M_dataplus._M_p != (pointer)local_1c8._M_string_length) {
          _Var16._M_p = local_1c8._M_dataplus._M_p;
          do {
            std::__cxx11::string::_M_replace((ulong)local_1a8,0,local_1a0,0x56c0bb);
            std::__cxx11::string::_M_append((char *)local_1a8,*(ulong *)_Var16._M_p);
            pcVar18 = cmTarget::GetProperty(this->Target,(string *)local_1a8);
            if (pcVar18 == (char *)0x0) {
              cmTarget::SetProperty(this->Target,(string *)local_1a8,"");
            }
            _Var16._M_p = _Var16._M_p + 0x20;
          } while (_Var16._M_p != (pointer)local_1c8._M_string_length);
        }
      }
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8,
                        CONCAT71(local_198._M_allocated_capacity._1_7_,local_198._M_local_buf[0]) +
                        1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1c8);
    }
  }
LAB_002a2574:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                                 cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }
  if (this->Target->IsImported() &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "IMPORTED library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (this->CurrentProcessingState == ProcessingPlainPrivateInterface ||
     this->CurrentProcessingState == ProcessingPlainPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
     this->CurrentProcessingState == ProcessingKeywordPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile->GetExecutionContext())) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig
        << " signature for target_link_libraries has "
           "already been used with the target \""
        << this->Target->GetName()
        << "\".  All uses of target_link_libraries with a target " << modal
        << " be either all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  bool warnRemoteInterface = false;
  bool rejectRemoteLinking = false;
  bool encodeRemoteReference = false;
  if (this->Makefile != this->Target->GetMakefile()) {
    // The LHS target was created in another directory.
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0079)) {
      case cmPolicies::WARN:
        warnRemoteInterface = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        rejectRemoteLinking = true;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        encodeRemoteReference = true;
        break;
    }
  }

  std::string libRef;
  if (encodeRemoteReference && !cmSystemTools::FileIsFullPath(lib)) {
    // This is a library name added by a caller that is not in the
    // same directory as the target was created.  Add a suffix to
    // the name to tell ResolveLinkItem to look up the name in the
    // caller's directory.
    cmDirectoryId const dirId = this->Makefile->GetDirectoryId();
    libRef = lib + CMAKE_DIRECTORY_ID_SEP + dirId.String;
  } else {
    // This is an absolute path or a library name added by a caller
    // in the same directory as the target was created.  We can use
    // the original name directly.
    libRef = lib;
  }

  // Handle normal case where the command was called with another keyword than
  // INTERFACE / LINK_INTERFACE_LIBRARIES or none at all. (The "LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      this->CurrentProcessingState != ProcessingPlainLinkInterface) {

    if (rejectRemoteLinking) {
      std::ostringstream e;
      e << "Attempt to add link library \"" << lib << "\" to target \""
        << this->Target->GetName()
        << "\" which is not built in this directory.\n"
        << "This is allowed only when policy CMP0079 is set to NEW.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }

    cmTarget* tgt = this->Makefile->GetGlobalGenerator()->FindTarget(lib);

    if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::UNKNOWN_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
        !tgt->IsExecutableWithExports()) {
      std::ostringstream e;
      e << "Target \"" << lib << "\" of type "
        << cmState::GetTargetTypeName(tgt->GetType())
        << " may not be linked into another target.  One may link only to "
           "INTERFACE, OBJECT, STATIC or SHARED libraries, or to executables "
           "with the ENABLE_EXPORTS property set.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }

    this->Target->AddLinkLibrary(*this->Makefile, lib, libRef, llt);
  }

  if (warnRemoteInterface) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0079) << "\n"
      "Target\n  " << this->Target->GetName() << "\nis not created in this "
      "directory.  For compatibility with older versions of CMake, link "
      "library\n  " << lib << "\nwill be looked up in the directory in "
      "which the target was created rather than in this calling "
      "directory.";
    /* clang-format on */
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }

  // Handle (additional) case where the command was called with PRIVATE /
  // LINK_PRIVATE and stop its processing. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall only be populated if it is a
  // STATIC library.)
  if (this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
      this->CurrentProcessingState == ProcessingPlainPrivateInterface) {
    if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      std::string configLib =
        this->Target->GetDebugGeneratorExpressions(libRef, llt);
      if (cmGeneratorExpression::IsValidTargetName(lib) ||
          cmGeneratorExpression::Find(lib) != std::string::npos) {
        configLib = "$<LINK_ONLY:" + configLib + ">";
      }
      this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                   configLib.c_str());
    }
    return true;
  }

  // Handle general case where the command was called with another keyword than
  // PRIVATE / LINK_PRIVATE or none at all. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  this->Target->AppendProperty(
    "INTERFACE_LINK_LIBRARIES",
    this->Target->GetDebugGeneratorExpressions(libRef, llt).c_str());

  // Stop processing if called without any keyword.
  if (this->CurrentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  // Stop processing if policy CMP0022 is set to NEW.
  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();
  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }
  // Stop processing if called with an INTERFACE library on the LHS.
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Handle (additional) backward-compatibility case where the command was
  // called with PUBLIC / INTERFACE / LINK_PUBLIC / LINK_INTERFACE_LIBRARIES.
  // (The policy CMP0022 is not set to NEW.)
  {
    // Get the list of configurations considered to be DEBUG.
    std::vector<std::string> debugConfigs =
      this->Makefile->GetCMakeInstance()->GetDebugConfigs();
    std::string prop;

    // Include this library in the link interface for the target.
    if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the DEBUG configuration interfaces.
      for (std::string const& dc : debugConfigs) {
        prop = "LINK_INTERFACE_LIBRARIES_";
        prop += dc;
        this->Target->AppendProperty(prop, libRef.c_str());
      }
    }
    if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the non-DEBUG configuration interfaces.
      this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", libRef.c_str());

      // Make sure the DEBUG configuration interfaces exist so that the
      // general one will not be used as a fall-back.
      for (std::string const& dc : debugConfigs) {
        prop = "LINK_INTERFACE_LIBRARIES_";
        prop += dc;
        if (!this->Target->GetProperty(prop)) {
          this->Target->SetProperty(prop, "");
        }
      }
    }
  }
  return true;
}